

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

ExpParameter * __thiscall caffe::LayerParameter::mutable_exp_param(LayerParameter *this)

{
  ExpParameter *this_00;
  LayerParameter *this_local;
  
  set_has_exp_param(this);
  if (this->exp_param_ == (ExpParameter *)0x0) {
    this_00 = (ExpParameter *)operator_new(0x28);
    ExpParameter::ExpParameter(this_00);
    this->exp_param_ = this_00;
  }
  return this->exp_param_;
}

Assistant:

inline ::caffe::ExpParameter* LayerParameter::mutable_exp_param() {
  set_has_exp_param();
  if (exp_param_ == NULL) {
    exp_param_ = new ::caffe::ExpParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.LayerParameter.exp_param)
  return exp_param_;
}